

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O2

bool __thiscall HighsSearch::orbitsValidInChildNode(HighsSearch *this,HighsDomainChange *branchChg)

{
  StabilizerOrbits *this_00;
  bool bVar1;
  bool bVar2;
  
  this_00 = (this->nodestack).
            super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1].stabilizerOrbits.
            super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bVar2 = true;
  if (((this_00 != (StabilizerOrbits *)0x0) &&
      ((this_00->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this_00->orbitCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish)) &&
     (bVar1 = StabilizerOrbits::isStabilized(this_00,branchChg->column), !bVar1)) {
    if ((branchChg->boundtype == kUpper) &&
       (bVar2 = HighsDomain::isGlobalBinary(&this->localdom,branchChg->column), bVar2)) {
      return true;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HighsSearch::orbitsValidInChildNode(
    const HighsDomainChange& branchChg) const {
  HighsInt branchCol = branchChg.column;
  // if the variable is integral or we are in an up branch the stabilizer only
  // stays valid if the column has been stabilized
  const NodeData& currNode = nodestack.back();
  if (!currNode.stabilizerOrbits ||
      currNode.stabilizerOrbits->orbitCols.empty() ||
      currNode.stabilizerOrbits->isStabilized(branchCol))
    return true;

  // a down branch stays valid if the variable is binary
  if (branchChg.boundtype == HighsBoundType::kUpper &&
      localdom.isGlobalBinary(branchChg.column))
    return true;

  return false;
}